

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall icu_63::Normalizer2Impl::hasDecompBoundaryBefore(Normalizer2Impl *this,UChar32 c)

{
  UBool UVar1;
  uint16_t norm16;
  bool local_15;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  local_15 = true;
  if ((int)(uint)(ushort)this->minLcccCP <= c) {
    if ((c < 0x10000) && (UVar1 = singleLeadMightHaveNonZeroFCD16(this,c), UVar1 == '\0')) {
      return '\x01';
    }
    norm16 = getNorm16(this,c);
    UVar1 = norm16HasDecompBoundaryBefore(this,norm16);
    local_15 = UVar1 != '\0';
  }
  return local_15;
}

Assistant:

UBool Normalizer2Impl::hasDecompBoundaryBefore(UChar32 c) const {
    return c < minLcccCP || (c <= 0xffff && !singleLeadMightHaveNonZeroFCD16(c)) ||
        norm16HasDecompBoundaryBefore(getNorm16(c));
}